

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_tuple.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_1ffb88::kamikaze::kamikaze(kamikaze *this,kamikaze *param_1)

{
  runtime_error *this_00;
  string local_38;
  kamikaze *local_18;
  kamikaze *param_1_local;
  kamikaze *this_local;
  
  if (4 < (anonymous_namespace)::kamikaze::instances_count) {
    local_18 = param_1;
    param_1_local = this;
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    burst::literals::operator____u8s_abi_cxx11_(&local_38,anon_var_dwarf_200989,0xd);
    std::runtime_error::runtime_error(this_00,(string *)&local_38);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  (anonymous_namespace)::kamikaze::instances_count =
       (anonymous_namespace)::kamikaze::instances_count + 1;
  return;
}

Assistant:

kamikaze (kamikaze &&)
        {
            if (instances_count > 4)
            {
                throw std::runtime_error(u8"Привет!"_u8s);
            }
            ++instances_count;
        }